

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elempatch.c
# Opt level: O1

void fill_func3(int nelem,int type,void *buf)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar8;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar11;
  
  auVar2 = _DAT_001b7030;
  switch(type) {
  case 0x3e9:
    if (0 < nelem) {
      lVar3 = (ulong)(uint)nelem - 1;
      auVar4._8_4_ = (int)lVar3;
      auVar4._0_8_ = lVar3;
      auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
      lVar3 = 0;
      auVar4 = auVar4 ^ _DAT_001b7030;
      auVar9 = _DAT_001b7010;
      auVar12 = _DAT_001b7020;
      do {
        auVar15 = auVar12 ^ auVar2;
        iVar8 = auVar4._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar8 && auVar4._0_4_ < auVar15._0_4_ || iVar8 < auVar15._4_4_
                    ) & 1)) {
          *(undefined4 *)((long)buf + lVar3) = 2;
        }
        if ((auVar15._12_4_ != auVar4._12_4_ || auVar15._8_4_ <= auVar4._8_4_) &&
            auVar15._12_4_ <= auVar4._12_4_) {
          *(undefined4 *)((long)buf + lVar3 + 4) = 2;
        }
        iVar16 = SUB164(auVar9 ^ auVar2,4);
        if (iVar16 <= iVar8 && (iVar16 != iVar8 || SUB164(auVar9 ^ auVar2,0) <= auVar4._0_4_)) {
          *(undefined4 *)((long)buf + lVar3 + 8) = 2;
          *(undefined4 *)((long)buf + lVar3 + 0xc) = 2;
        }
        lVar11 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 4;
        auVar12._8_8_ = lVar11 + 4;
        lVar11 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 4;
        auVar9._8_8_ = lVar11 + 4;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(nelem + 3U >> 2) << 4 != lVar3);
    }
    break;
  case 0x3ea:
    if (0 < nelem) {
      lVar3 = (ulong)(uint)nelem - 1;
      auVar6._8_4_ = (int)lVar3;
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = (int)((ulong)lVar3 >> 0x20);
      lVar3 = 0;
      auVar6 = auVar6 ^ _DAT_001b7030;
      auVar10 = _DAT_001b7020;
      do {
        auVar15 = auVar10 ^ auVar2;
        if ((bool)(~(auVar15._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar15._0_4_ ||
                    auVar6._4_4_ < auVar15._4_4_) & 1)) {
          *(undefined8 *)((long)buf + lVar3) = 2;
        }
        if ((auVar15._12_4_ != auVar6._12_4_ || auVar15._8_4_ <= auVar6._8_4_) &&
            auVar15._12_4_ <= auVar6._12_4_) {
          *(undefined8 *)((long)buf + lVar3 + 8) = 2;
        }
        lVar11 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar11 + 2;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(nelem + 1U >> 1) << 4 != lVar3);
    }
    break;
  case 0x3eb:
    if (0 < nelem) {
      lVar3 = (ulong)(uint)nelem - 1;
      auVar5._8_4_ = (int)lVar3;
      auVar5._0_8_ = lVar3;
      auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
      lVar3 = 0;
      auVar5 = auVar5 ^ _DAT_001b7030;
      auVar14 = _DAT_001b7010;
      auVar13 = _DAT_001b7020;
      do {
        auVar15 = auVar13 ^ auVar2;
        iVar8 = auVar5._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar8 && auVar5._0_4_ < auVar15._0_4_ || iVar8 < auVar15._4_4_
                    ) & 1)) {
          *(undefined4 *)((long)buf + lVar3) = 0x40000000;
        }
        if ((auVar15._12_4_ != auVar5._12_4_ || auVar15._8_4_ <= auVar5._8_4_) &&
            auVar15._12_4_ <= auVar5._12_4_) {
          *(undefined4 *)((long)buf + lVar3 + 4) = 0x40000000;
        }
        iVar16 = SUB164(auVar14 ^ auVar2,4);
        if (iVar16 <= iVar8 && (iVar16 != iVar8 || SUB164(auVar14 ^ auVar2,0) <= auVar5._0_4_)) {
          *(undefined4 *)((long)buf + lVar3 + 8) = 0x40000000;
          *(undefined4 *)((long)buf + lVar3 + 0xc) = 0x40000000;
        }
        lVar11 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 4;
        auVar13._8_8_ = lVar11 + 4;
        lVar11 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar11 + 4;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(nelem + 3U >> 2) << 4 != lVar3);
    }
    break;
  case 0x3ec:
    if (0 < nelem) {
      lVar3 = (ulong)(uint)nelem - 1;
      auVar7._8_4_ = (int)lVar3;
      auVar7._0_8_ = lVar3;
      auVar7._12_4_ = (int)((ulong)lVar3 >> 0x20);
      lVar3 = 0;
      auVar7 = auVar7 ^ _DAT_001b7030;
      auVar15 = _DAT_001b7020;
      do {
        auVar14 = auVar15 ^ auVar2;
        if ((bool)(~(auVar14._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar14._0_4_ ||
                    auVar7._4_4_ < auVar14._4_4_) & 1)) {
          *(undefined8 *)((long)buf + lVar3) = 0x4000000000000000;
        }
        if ((auVar14._12_4_ != auVar7._12_4_ || auVar14._8_4_ <= auVar7._8_4_) &&
            auVar14._12_4_ <= auVar7._12_4_) {
          *(undefined8 *)((long)buf + lVar3 + 8) = 0x4000000000000000;
        }
        lVar11 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar11 + 2;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(nelem + 1U >> 1) << 4 != lVar3);
    }
    break;
  default:
    GA_Error(" wrong data type ",type);
    return;
  case 0x3ee:
    if (0 < nelem) {
      lVar3 = 0;
      do {
        *(long *)((long)buf + lVar3 * 4) = SUB168(ZEXT416(0x403504f3),0);
        lVar3 = lVar3 + 2;
      } while (lVar3 < nelem * 2 + -1);
    }
    break;
  case 0x3ef:
    if (0 < nelem) {
      lVar3 = 0;
      do {
        puVar1 = (undefined8 *)((long)buf + lVar3 * 8);
        *puVar1 = 0x4006a09e667f3bcd;
        puVar1[1] = 0;
        lVar3 = lVar3 + 2;
      } while (lVar3 < nelem * 2 + -1);
    }
  }
  return;
}

Assistant:

void
fill_func3 (int nelem, int type, void *buf)
  /*taking the absolute of the ifun() */
{
  /*int i,size=MA_sizeof(MT_CHAR,type,1);*/

  int i;

  switch (type)
  {
    case C_FLOAT:
      for (i = 0; i < nelem; i++)
        ((float *) buf)[i] = (float) GA_ABS (ifun (i));
      break;
    case C_LONG:
      for (i = 0; i < nelem; i++)
        ((long *) buf)[i] = (long) GA_ABS (ifun (i));
      break;
    case C_DBL:
      for (i = 0; i < nelem; i++)
        ((double *) buf)[i] = (double) GA_ABS (ifun (i));
      break;
    case C_DCPL:
      for (i = 0; i < 2 * nelem - 1; i = i + 2)
      {
        ((double *) buf)[i] =
          sqrt ((double)
              (ifun (i) * ifun (i) + ifun (i + 1) * ifun (i + 1)));
        ((double *) buf)[i + 1] = 0.0;
      }
      break;
    case C_SCPL:
      for (i = 0; i < 2 * nelem - 1; i = i + 2)
      {
        ((float *) buf)[i] =
          sqrt ((float)
              (ifun (i) * ifun (i) + ifun (i + 1) * ifun (i + 1)));
        ((float *) buf)[i + 1] = 0.0;
      }
      break;
    case C_INT:
      for (i = 0; i < nelem; i++)
        ((int *) buf)[i] = GA_ABS (ifun (i));
      break;
    default:
      GA_Error (" wrong data type ", type);

  }
}